

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

bool_t ecpDetIsZero(word *a,word *b,word *p,size_t n,void *stack)

{
  bool_t bVar1;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *t2;
  word *t1;
  word *stack_00;
  word *mod;
  
  stack_00 = in_R8 + (long)in_RCX;
  mod = stack_00 + (long)in_RCX;
  zzSqrMod(in_RSI,in_RDX,in_RCX,(size_t)mod,in_R8);
  zzMulMod(in_RSI,in_RDX,in_RCX,mod,(size_t)in_R8,stack_00);
  zzMulWMod(in_RSI,in_RDX,(word)in_RCX,mod,(size_t)in_R8,stack_00);
  zzSqrMod(in_RSI,in_RDX,in_RCX,(size_t)mod,in_R8);
  zzMulWMod(in_RSI,in_RDX,(word)in_RCX,mod,(size_t)in_R8,stack_00);
  zzAddMod(t2,in_RDI,in_RSI,in_RDX,(size_t)in_RCX);
  bVar1 = wwIsZero(in_R8,(size_t)in_RCX);
  return bVar1;
}

Assistant:

bool_t ecpDetIsZero(const word a[], const word b[], const word p[], size_t n, 
	void* stack)
{
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// t1 <- 4 A^3
	zzSqrMod(t1, a, p, n, stack);
	zzMulMod(t1, t1, a, p, n, stack);
	zzMulWMod(t1, t1, 4, p, n, stack);
	// t2 <- 27 B^2
	zzSqrMod(t2, b, p, n, stack);
	zzMulWMod(t2, t2, 27, p, n, stack);
	// t1 <- t1 + t2 [4 A^3 + 27 B^2 -- дискриминант]
	zzAddMod(t1, t1, t2, p, n);
	// t1 == 0?
	return wwIsZero(t1, n);
}